

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

bool __thiscall HModel::workArrays_OK(HModel *this,int phase)

{
  double dVar1;
  value_type vVar2;
  double dVar3;
  value_type vVar4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  int in_ESI;
  HModel *in_RDI;
  int var_4;
  int row_1;
  double sense_col_cost;
  int var_3;
  int col_1;
  int var_2;
  int var_1;
  int row;
  int var;
  int col;
  bool ok;
  uint local_44;
  uint local_30;
  uint local_2c;
  uint local_24;
  uint local_1c;
  bool local_1;
  
  local_1 = true;
  if (in_ESI != 1) {
    for (local_1c = 0; (int)local_1c < in_RDI->numCol; local_1c = local_1c + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workLower,(long)(int)local_1c);
      bVar5 = hsol_isInfinity(in_RDI,-*pvVar7);
      if (!bVar5) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->workLower,(long)(int)local_1c);
        dVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colLower,(long)(int)local_1c);
        local_1 = dVar1 == *pvVar7;
        if (!local_1) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->colLower,(long)(int)local_1c);
          vVar2 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->workLower,(long)(int)local_1c);
          printf("For col %d, workLower should be %g but is %g\n",vVar2,*pvVar7,(ulong)local_1c);
          return local_1;
        }
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workUpper,(long)(int)local_1c);
      bVar5 = hsol_isInfinity(in_RDI,*pvVar7);
      if (!bVar5) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->workUpper,(long)(int)local_1c);
        dVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colUpper,(long)(int)local_1c);
        local_1 = dVar1 == *pvVar7;
        if (!local_1) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->colUpper,(long)(int)local_1c);
          vVar2 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->workUpper,(long)(int)local_1c);
          printf("For col %d, workUpper should be %g but is %g\n",vVar2,*pvVar7,(ulong)local_1c);
          return local_1;
        }
      }
    }
    for (local_24 = 0; (int)local_24 < in_RDI->numRow; local_24 = local_24 + 1) {
      iVar6 = in_RDI->numCol + local_24;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workLower,(long)iVar6);
      bVar5 = hsol_isInfinity(in_RDI,-*pvVar7);
      if (!bVar5) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->workLower,(long)iVar6);
        dVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowUpper,(long)(int)local_24);
        local_1 = dVar1 == -*pvVar7;
        if (!local_1) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->rowUpper,(long)(int)local_24);
          vVar2 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->workLower,(long)iVar6);
          printf("For row %d, workLower should be %g but is %g\n",-vVar2,*pvVar7,(ulong)local_24);
          return local_1;
        }
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workUpper,(long)iVar6);
      bVar5 = hsol_isInfinity(in_RDI,*pvVar7);
      if (!bVar5) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->workUpper,(long)iVar6);
        dVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->rowLower,(long)(int)local_24);
        local_1 = dVar1 == -*pvVar7;
        if (!local_1) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->rowLower,(long)(int)local_24);
          vVar2 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->workUpper,(long)iVar6);
          printf("For row %d, workUpper should be %g but is %g\n",-vVar2,*pvVar7,(ulong)local_24);
          return local_1;
        }
      }
    }
  }
  for (local_2c = 0; (int)local_2c < in_RDI->numTot; local_2c = local_2c + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->workRange,(long)(int)local_2c);
    dVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->workUpper,(long)(int)local_2c);
    dVar3 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->workLower,(long)(int)local_2c);
    local_1 = dVar1 == dVar3 - *pvVar7;
    if (!local_1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workUpper,(long)(int)local_2c);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workLower,(long)(int)local_2c);
      dVar3 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workUpper,(long)(int)local_2c);
      vVar2 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workLower,(long)(int)local_2c);
      vVar4 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workRange,(long)(int)local_2c);
      printf("For variable %d, workRange should be %g = %g - %g but is %g\n",dVar1 - dVar3,vVar2,
             vVar4,*pvVar7,(ulong)local_2c);
      return local_1;
    }
  }
  if (in_RDI->problemPerturbed == 0) {
    for (local_30 = 0; (int)local_30 < in_RDI->numCol; local_30 = local_30 + 1) {
      iVar6 = in_RDI->objSense;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->colCost,(long)(int)local_30);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workCost,(long)(int)local_30);
      local_1 = *pvVar7 == (double)iVar6 * dVar1;
      if (!local_1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->colLower,(long)(int)local_30);
        vVar2 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->workCost,(long)(int)local_30);
        printf("For col %d, workLower should be %g but is %g\n",vVar2,*pvVar7,(ulong)local_30);
        return local_1;
      }
    }
    for (local_44 = 0; (int)local_44 < in_RDI->numRow; local_44 = local_44 + 1) {
      iVar6 = in_RDI->numCol + local_44;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->workCost,(long)iVar6);
      local_1 = *pvVar7 == 0.0;
      if (!local_1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->workCost,(long)iVar6);
        printf("For row %d, workCost should be zero but is %g\n",*pvVar7,(ulong)local_44);
        return local_1;
      }
    }
  }
  return local_1;
}

Assistant:

bool HModel::workArrays_OK(int phase) {
  //  printf("Called workArrays_OK(%d)\n", phase);cout << flush;
  bool ok = true;
  //Don't check phase 1 bounds: these will have been set by solve() so can be trusted
  if (phase != 1) {
    for (int col = 0; col < numCol; ++col) {
      int var = col;
      if (!hsol_isInfinity(-workLower[var])) {
	ok = workLower[var] == colLower[col];
	if (!ok) {
	  printf("For col %d, workLower should be %g but is %g\n", col, colLower[col], workLower[var]);
	  return ok;
	}
      }
      if (!hsol_isInfinity(workUpper[var])) {
	ok = workUpper[var] == colUpper[col];
	if (!ok) {
	  printf("For col %d, workUpper should be %g but is %g\n", col, colUpper[col], workUpper[var]);
	  return ok;
	}
      }
    }
    for (int row = 0; row < numRow; ++row) {
      int var = numCol + row;
      if (!hsol_isInfinity(-workLower[var])) {
	ok = workLower[var] == -rowUpper[row];
	if (!ok) {
	  printf("For row %d, workLower should be %g but is %g\n", row, -rowUpper[row], workLower[var]);
	  return ok;
	}
      }
      if (!hsol_isInfinity(workUpper[var])) {
	ok = workUpper[var] == -rowLower[row];
	if (!ok) {
	  printf("For row %d, workUpper should be %g but is %g\n", row, -rowLower[row], workUpper[var]);
	  return ok;
	}
      }
    }
  }
  for (int var = 0; var < numTot; ++var) {
    ok = workRange[var] == (workUpper[var] - workLower[var]);
    if (!ok) {
      printf("For variable %d, workRange should be %g = %g - %g but is %g\n",
	     var, workUpper[var] - workLower[var], workUpper[var], workLower[var], workRange[var]);
      return ok;
    }
  }
  //Don't check perturbed costs: these will have been set by solve() so can be trusted
  if (!problemPerturbed) {
    for (int col = 0; col < numCol; ++col) {
      int var = col;
      double sense_col_cost = objSense*colCost[col];
      ok = workCost[var] == sense_col_cost;
      if (!ok) {
	printf("For col %d, workLower should be %g but is %g\n", col, colLower[col], workCost[var]);
	return ok;
      }
    }
    for (int row = 0; row < numRow; ++row) {
      int var = numCol + row;
      ok = workCost[var] == 0.;
      if (!ok) {
	printf("For row %d, workCost should be zero but is %g\n", row, workCost[var]);
	return ok;
      }
    }
  }
  //ok must be true if we reach here
  assert(ok);
  return ok;
}